

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdGetTransactionFromBlock(void *handle,void *block_handle,char *txid,char **tx_hex)

{
  pointer pcVar1;
  Block *this;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Transaction tx;
  allocator local_b1;
  undefined1 local_b0 [64];
  string local_70;
  string local_50;
  
  cfd::Initialize();
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"BlockOpe","");
  cfd::capi::CheckBuffer(block_handle,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (tx_hex == (char **)0x0) {
    local_b0._0_8_ = "cfdcapi_block.cpp";
    local_b0._8_4_ = 0x103;
    local_b0._16_8_ = "CfdGetTransactionFromBlock";
    cfd::core::logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"tx_hex is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Failed to parameter. tx_hex is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_b0._0_8_ = "cfdcapi_block.cpp";
    local_b0._8_4_ = 0x109;
    local_b0._16_8_ = "CfdGetTransactionFromBlock";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Block **)((long)block_handle + 0x18);
  if (this != (Block *)0x0) {
    if (*(int *)((long)block_handle + 0x10) < 3) {
      std::__cxx11::string::string((string *)&local_50,txid,&local_b1);
      cfd::core::Txid::Txid((Txid *)&local_70,&local_50);
      cfd::core::Block::GetTransaction((Transaction *)local_b0,this,(Txid *)&local_70);
      local_70._M_dataplus._M_p = (pointer)&PTR__Txid_0087c9b8;
      if ((void *)local_70._M_string_length != (void *)0x0) {
        operator_delete((void *)local_70._M_string_length,
                        local_70.field_2._8_8_ - local_70._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_70,(AbstractTransaction *)local_b0);
      pcVar3 = cfd::capi::CreateString(&local_70);
      *tx_hex = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      cfd::core::Transaction::~Transaction((Transaction *)local_b0);
      return 0;
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"Invalid handle state. block is null","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTransactionFromBlock(
    void* handle, void* block_handle, const char* txid, char** tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      auto tx = block_data->block->GetTransaction(Txid(std::string(txid)));
      *tx_hex = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}